

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_ascii(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  char *pcVar1;
  uchar *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  uint local_1b0;
  uint local_1a8;
  uint local_1a0;
  char *local_198;
  long local_190;
  ulongT local_188;
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uchar *local_170;
  uchar *local_168;
  char *local_160;
  uint local_158;
  bool local_151;
  undefined1 *local_150;
  char *local_148;
  CImgIOException *local_140;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uchar *local_128;
  char *local_120;
  char *local_118;
  undefined1 local_10d;
  uint local_10c;
  CImg<char> *local_108;
  uint local_fc;
  FILE *local_f8;
  CImgArgumentException *local_f0;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uchar *local_d8;
  char *local_d0;
  char *local_c8;
  CImg<unsigned_char> *local_c0;
  uchar *local_b8;
  uchar *ptr;
  double val;
  ulongT off;
  ulongT siz;
  uint local_90;
  uint dc;
  uint dz;
  uint dy;
  uint dx;
  int err;
  CImg<char> line;
  FILE *nfile;
  char *filename_local;
  FILE *file_local;
  CImg<unsigned_char> *this_local;
  
  local_c0 = this;
  if ((file == (FILE *)0x0) && (filename == (char *)0x0)) {
    local_f0 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    local_e8 = local_c0->_width;
    local_e4 = local_c0->_height;
    local_e0 = local_c0->_depth;
    local_dc = local_c0->_spectrum;
    local_d8 = local_c0->_data;
    local_d0 = "non-";
    if ((local_c0->_is_shared & 1U) != 0) {
      local_d0 = "";
    }
    local_1c8 = pixel_type();
    local_1d0 = local_d0;
    local_1d8 = local_d8;
    local_c8 = local_1c8;
    CImgArgumentException::CImgArgumentException
              (local_f0,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_ascii(): Specified filename is (null)."
               ,(ulong)local_e8,(ulong)local_e4,(ulong)local_e0,(ulong)local_dc);
    __cxa_throw(local_f0,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_f8 = (FILE *)file;
  if (file == (FILE *)0x0) {
    local_f8 = cimg::fopen(filename,"rb");
  }
  line._data = (char *)local_f8;
  local_108 = (CImg<char> *)&dx;
  CImg<char>::CImg(local_108,0x100,1,1,1);
  pcVar1 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_108);
  *pcVar1 = '\0';
  local_fc = __isoc99_fscanf(line._data,"%255[^\n]",line._16_8_);
  dz = 0;
  dc = 1;
  local_90 = 1;
  siz._4_4_ = 1;
  dy = local_fc;
  pcVar1 = cimg_library::CImg::operator_cast_to_char_((CImg *)&dx);
  local_10d = 0;
  __isoc99_sscanf(pcVar1,"%u%*c%u%*c%u%*c%u",&dz,&dc,&local_90,(long)&siz + 4);
  local_10c = __isoc99_fscanf(line._data,"%*[^0-9.eEinfa+-]");
  dy = local_10c;
  if ((((dz != 0) && (dc != 0)) && (local_90 != 0)) && (siz._4_4_ != 0)) {
    assign(local_c0,dz,dc,local_90,siz._4_4_);
    off = size(local_c0);
    dy = 1;
    local_b8 = local_c0->_data;
    for (val = 0.0; local_151 = (ulong)val < off && dy == 1, (ulong)val < off && dy == 1;
        val = (double)((long)val + 1)) {
      local_158 = __isoc99_fscanf(line._data,"%lf%*[^0-9.eEinfa+-]",&ptr);
      *local_b8 = (uchar)(int)(double)ptr;
      local_b8 = local_b8 + 1;
      dy = local_158;
    }
    if (dy != 1) {
      local_180 = local_c0->_width;
      local_17c = local_c0->_height;
      local_178 = local_c0->_depth;
      local_174 = local_c0->_spectrum;
      local_170 = local_c0->_data;
      local_168 = "non-";
      if ((local_c0->_is_shared & 1U) != 0) {
        local_168 = "";
      }
      local_1d0 = pixel_type();
      local_1c8 = (char *)((long)val + -1);
      local_188 = off;
      local_198 = filename;
      if (filename == (char *)0x0) {
        local_198 = "(FILE*)";
      }
      local_1b8 = local_198;
      local_1c0 = (char *)off;
      local_1d8 = local_168;
      local_190 = (long)local_1c8;
      local_160 = local_1d0;
      cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_ascii(): Only %lu/%lu values read from file \'%s\'."
                 ,(ulong)local_180,(ulong)local_17c,(ulong)local_178,(ulong)local_174,local_170);
    }
    if (file == (FILE *)0x0) {
      cimg::fclose((FILE *)line._data);
    }
    CImg<char>::~CImg((CImg<char> *)&dx);
    return local_c0;
  }
  if (file == (FILE *)0x0) {
    cimg::fclose((FILE *)line._data);
  }
  local_140 = (CImgIOException *)__cxa_allocate_exception(0x10);
  local_138 = local_c0->_width;
  local_134 = local_c0->_height;
  local_130 = local_c0->_depth;
  local_12c = local_c0->_spectrum;
  local_128 = local_c0->_data;
  local_120 = "non-";
  if ((local_c0->_is_shared & 1U) != 0) {
    local_120 = "";
  }
  local_1c8 = pixel_type();
  local_148 = filename;
  if (filename == (char *)0x0) {
    local_148 = "(FILE*)";
  }
  local_1a0 = siz._4_4_;
  local_1a8 = local_90;
  local_1b0 = dc;
  local_1b8 = (char *)CONCAT44(local_1b8._4_4_,dz);
  local_1c0 = local_148;
  local_1d0 = local_120;
  local_1d8 = local_128;
  local_150 = (undefined1 *)&local_1d8;
  local_118 = local_1c8;
  CImgIOException::CImgIOException
            (local_140,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_ascii(): Invalid Ascii header in file \'%s\', image dimensions are set to (%u,%u,%u,%u)."
             ,(ulong)local_138,(ulong)local_134,(ulong)local_130,(ulong)local_12c);
  __cxa_throw(local_140,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

CImg<T>& _load_ascii(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_ascii(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<charT> line(256); *line = 0;
      int err = std::fscanf(nfile,"%255[^\n]",line._data);
      unsigned int dx = 0, dy = 1, dz = 1, dc = 1;
      cimg_sscanf(line,"%u%*c%u%*c%u%*c%u",&dx,&dy,&dz,&dc);
      err = std::fscanf(nfile,"%*[^0-9.eEinfa+-]");
      if (!dx || !dy || !dz || !dc) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_ascii(): Invalid Ascii header in file '%s', image dimensions are set "
                              "to (%u,%u,%u,%u).",
                              cimg_instance,
                              filename?filename:"(FILE*)",dx,dy,dz,dc);
      }
      assign(dx,dy,dz,dc);
      const ulongT siz = size();
      ulongT off = 0;
      double val;
      T *ptr = _data;
      for (err = 1, off = 0; off<siz && err==1; ++off) {
        err = std::fscanf(nfile,"%lf%*[^0-9.eEinfa+-]",&val);
        *(ptr++) = (T)val;
      }
      if (err!=1)
        cimg::warn(_cimg_instance
                   "load_ascii(): Only %lu/%lu values read from file '%s'.",
                   cimg_instance,
                   off - 1,siz,filename?filename:"(FILE*)");

      if (!file) cimg::fclose(nfile);
      return *this;
    }